

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

UBool __thiscall icu_63::RegexMatcher::isWordBoundary(RegexMatcher *this,int64_t pos)

{
  int iVar1;
  UText *pUVar2;
  bool bVar3;
  UBool UVar4;
  int8_t iVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  
  if (pos < this->fLookLimit) {
    pUVar2 = this->fInputText;
    lVar9 = pos - pUVar2->chunkNativeStart;
    if (((lVar9 < 0) || (pUVar2->nativeIndexingLimit <= lVar9)) ||
       (0xdbff < (ushort)pUVar2->chunkContents[lVar9])) {
      utext_setNativeIndex_63(pUVar2,pos);
    }
    else {
      pUVar2->chunkOffset = (int32_t)lVar9;
    }
    pUVar2 = this->fInputText;
    if ((pUVar2->chunkLength <= pUVar2->chunkOffset) ||
       (uVar8 = (uint)(ushort)pUVar2->chunkContents[pUVar2->chunkOffset],
       0xd7ff < (ushort)pUVar2->chunkContents[pUVar2->chunkOffset])) {
      uVar8 = utext_current32_63(pUVar2);
    }
    UVar4 = u_hasBinaryProperty_63(uVar8,UCHAR_GRAPHEME_EXTEND);
    bVar6 = 0;
    bVar3 = false;
    if (UVar4 == '\0') {
      iVar5 = u_charType_63(uVar8);
      bVar6 = 0;
      bVar3 = false;
      if (iVar5 != '\x10') {
        bVar6 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar8);
        bVar3 = true;
      }
    }
    if (!bVar3) {
      return '\0';
    }
  }
  else {
    this->fHitEnd = '\x01';
    bVar6 = 0;
  }
  bVar7 = 0;
  do {
    pUVar2 = this->fInputText;
    if (pUVar2->nativeIndexingLimit < pUVar2->chunkOffset) {
      lVar9 = (*pUVar2->pFuncs->mapOffsetToNative)(pUVar2);
    }
    else {
      lVar9 = (long)pUVar2->chunkOffset + pUVar2->chunkNativeStart;
    }
    if (lVar9 <= this->fLookStart) break;
    pUVar2 = this->fInputText;
    iVar1 = pUVar2->chunkOffset;
    if (((long)iVar1 < 1) || (0xd7ff < (ushort)pUVar2->chunkContents[(long)iVar1 + -1])) {
      uVar8 = utext_previous32_63(pUVar2);
    }
    else {
      pUVar2->chunkOffset = iVar1 - 1U;
      uVar8 = (uint)(ushort)pUVar2->chunkContents[iVar1 - 1U];
    }
    UVar4 = u_hasBinaryProperty_63(uVar8,UCHAR_GRAPHEME_EXTEND);
    bVar3 = true;
    if ((UVar4 == '\0') && (iVar5 = u_charType_63(uVar8), iVar5 != '\x10')) {
      bVar7 = UnicodeSet::contains(this->fPattern->fStaticSets[1],uVar8);
      bVar3 = false;
    }
  } while (bVar3);
  return bVar7 ^ bVar6;
}

Assistant:

UBool RegexMatcher::isWordBoundary(int64_t pos) {
    UBool isBoundary = FALSE;
    UBool cIsWord    = FALSE;

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
    } else {
        // Determine whether char c at current position is a member of the word set of chars.
        // If we're off the end of the string, behave as though we're not at a word char.
        UTEXT_SETNATIVEINDEX(fInputText, pos);
        UChar32  c = UTEXT_CURRENT32(fInputText);
        if (u_hasBinaryProperty(c, UCHAR_GRAPHEME_EXTEND) || u_charType(c) == U_FORMAT_CHAR) {
            // Current char is a combining one.  Not a boundary.
            return FALSE;
        }
        cIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(c);
    }

    // Back up until we come to a non-combining char, determine whether
    //  that char is a word char.
    UBool prevCIsWord = FALSE;
    for (;;) {
        if (UTEXT_GETNATIVEINDEX(fInputText) <= fLookStart) {
            break;
        }
        UChar32 prevChar = UTEXT_PREVIOUS32(fInputText);
        if (!(u_hasBinaryProperty(prevChar, UCHAR_GRAPHEME_EXTEND)
              || u_charType(prevChar) == U_FORMAT_CHAR)) {
            prevCIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(prevChar);
            break;
        }
    }
    isBoundary = cIsWord ^ prevCIsWord;
    return isBoundary;
}